

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

nullres nullcSaveListing(char *fileName)

{
  bool bVar1;
  int iVar2;
  undefined1 local_38 [8];
  TraceScope traceScope;
  char *fileName_local;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    fileName_local._7_1_ = '\0';
  }
  else {
    if (nullcSaveListing::token == '\0') {
      iVar2 = __cxa_guard_acquire(&nullcSaveListing::token);
      if (iVar2 != 0) {
        nullcSaveListing::token = NULLC::TraceGetToken("nullc","nullcSaveListing");
        __cxa_guard_release(&nullcSaveListing::token);
      }
    }
    NULLC::TraceScope::TraceScope((TraceScope *)local_38,nullcSaveListing::token);
    if (NULLC::compilerCtx == (CompilerContext *)0x0) {
      NULLC::nullcLastError = "ERROR: there is no active compiler context";
      fileName_local._7_1_ = '\0';
    }
    else {
      bVar1 = SaveListing(NULLC::compilerCtx,fileName);
      if (bVar1) {
        fileName_local._7_1_ = '\x01';
      }
      else {
        NULLC::nullcLastError = NULLC::compilerCtx->errorBuf;
        fileName_local._7_1_ = '\0';
      }
    }
    NULLC::TraceScope::~TraceScope((TraceScope *)local_38);
  }
  return fileName_local._7_1_;
}

Assistant:

nullres nullcSaveListing(const char *fileName)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(0);

	TRACE_SCOPE("nullc", "nullcSaveListing");

	if(!compilerCtx)
	{
		nullcLastError = "ERROR: there is no active compiler context";
		return 0;
	}

	if(!SaveListing(*compilerCtx, fileName))
	{
		nullcLastError = compilerCtx->errorBuf;
		return 0;
	}

	return 1;
}